

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

VirtualIterator<Kernel::Term_*> __thiscall
Lib::getUniquePersistentIterator<Lib::VirtualIterator<Kernel::Term*>>
          (Lib *this,VirtualIterator<Kernel::Term_*> *it)

{
  int *piVar1;
  int iVar2;
  UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_> *this_00;
  
  iVar2 = (*it->_core->_vptr_IteratorCore[2])();
  if ((char)iVar2 == '\0') {
    VirtualIterator<Kernel::Term_*>::getEmpty();
  }
  else {
    this_00 = (UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_> *)
              ::operator_new(0x20);
    UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_>::UniquePersistentIterator
              (this_00,it);
    *(UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_> **)this = this_00;
    piVar1 = &(this_00->super_IteratorCore<Kernel::Term_*>)._refCnt;
    *piVar1 = *piVar1 + 1;
  }
  return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
}

Assistant:

inline
VirtualIterator<ELEMENT_TYPE(Inner)> getUniquePersistentIterator(Inner it)
{
  if(!it.hasNext()) {
    return VirtualIterator<ELEMENT_TYPE(Inner)>::getEmpty();
  }
  return vi( new UniquePersistentIterator<Inner>(it) );
}